

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O3

void __thiscall ser::FileFormat::~FileFormat(FileFormat *this)

{
  pointer pcVar1;
  
  this->_vptr_FileFormat = (_func_int **)&PTR__FileFormat_00137ce0;
  pcVar1 = (this->prefix_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->prefix_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->directory_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->directory_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~FileFormat() { }